

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageStore.cpp
# Opt level: O0

bool __thiscall
FIX::MessageStoreExceptionWrapper::set
          (MessageStoreExceptionWrapper *this,int num,string *msg,bool *threw,IOException *ex)

{
  byte bVar1;
  IOException *e;
  IOException *ex_local;
  bool *threw_local;
  string *msg_local;
  int num_local;
  MessageStoreExceptionWrapper *this_local;
  
  *threw = false;
  bVar1 = (**(code **)(**(long **)this + 0x10))(*(long **)this,num,msg);
  return (bool)(bVar1 & 1);
}

Assistant:

bool MessageStoreExceptionWrapper::set( int num, const std::string& msg, bool& threw, IOException& ex )
{
  threw = false;
  try { return m_pStore->set( num, msg ); }
  catch ( IOException & e ) { threw = true; ex = e; return false; }
}